

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOptimizationTests.cpp
# Opt level: O2

ProgramData * __thiscall
deqp::gles2::Performance::anon_unknown_1::FunctionInliningCase::generateProgramData
          (ProgramData *__return_storage_ptr__,FunctionInliningCase *this,bool optimized)

{
  ProgramData *pPVar1;
  undefined7 in_register_00000011;
  int local_1cc;
  FunctionInliningCase *local_1c8;
  int local_1c0;
  int local_1bc;
  ProgramData *local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string mainValueStatement;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string maybeFuncDefs;
  string precision;
  string expression;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_1c8 = this;
  local_1b8 = __return_storage_ptr__;
  Performance::(anonymous_namespace)::getShaderPrecision_abi_cxx11_
            (&precision,
             (_anonymous_namespace_ *)(ulong)(this->super_ShaderOptimizationCase).m_caseShaderType,
             (CaseShaderType)CONCAT71(in_register_00000011,optimized));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expression,"value*vec4(0.8, 0.7, 0.6, 0.9)",
             (allocator<char> *)&mainValueStatement);
  if (optimized) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&maybeFuncDefs,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)&mainValueStatement);
    std::operator+(&local_150,"\tvalue = ",&expression);
  }
  else {
    local_1c0 = local_1c8->m_callNestingDepth;
    std::operator+(&local_170,&precision," vec4 func0 (");
    std::operator+(&local_1b0,&local_170,&precision);
    std::operator+(&local_150,&local_1b0," vec4 value) { return ");
    std::operator+(&mainValueStatement,&local_150,&expression);
    std::operator+(&maybeFuncDefs,&mainValueStatement,"; }\n");
    std::__cxx11::string::~string((string *)&mainValueStatement);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_170);
    for (local_1cc = 1; local_1cc < local_1c0; local_1cc = local_1cc + 1) {
      std::operator+(&local_d0,&precision," vec4 func");
      de::toString<int>(&local_70,&local_1cc);
      std::operator+(&local_50,&local_d0,&local_70);
      std::operator+(&local_b0,&local_50," (");
      std::operator+(&local_170,&local_b0,&precision);
      std::operator+(&local_1b0,&local_170," vec4 v) { return func");
      local_1bc = local_1cc + -1;
      de::toString<int>(&local_90,&local_1bc);
      std::operator+(&local_150,&local_1b0,&local_90);
      std::operator+(&mainValueStatement,&local_150,"(v); }\n");
      std::__cxx11::string::append((string *)&maybeFuncDefs);
      std::__cxx11::string::~string((string *)&mainValueStatement);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    local_b0._M_dataplus._M_p._0_4_ = local_1c8->m_callNestingDepth + -1;
    de::toString<int>(&local_170,(int *)&local_b0);
    std::operator+(&local_1b0,"\tvalue = func",&local_170);
    std::operator+(&local_150,&local_1b0,"(value)");
  }
  std::operator+(&mainValueStatement,&local_150,";\n");
  std::__cxx11::string::~string((string *)&local_150);
  if (!optimized) {
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_170);
  }
  pPVar1 = local_1b8;
  defaultProgramData(local_1b8,(local_1c8->super_ShaderOptimizationCase).m_caseShaderType,
                     &maybeFuncDefs,&mainValueStatement);
  std::__cxx11::string::~string((string *)&mainValueStatement);
  std::__cxx11::string::~string((string *)&maybeFuncDefs);
  std::__cxx11::string::~string((string *)&expression);
  std::__cxx11::string::~string((string *)&precision);
  return pPVar1;
}

Assistant:

ProgramData generateProgramData (bool optimized) const
	{
		const string precision				= getShaderPrecision(m_caseShaderType);
		const string expression				= "value*vec4(0.8, 0.7, 0.6, 0.9)";
		const string maybeFuncDefs			= optimized ? "" : funcDefinitions(m_callNestingDepth, precision, expression);
		const string mainValueStatement		= (optimized ? "\tvalue = " + expression : "\tvalue = func" + toString(m_callNestingDepth-1) + "(value)") + ";\n";

		return defaultProgramData(m_caseShaderType, maybeFuncDefs, mainValueStatement);
	}